

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::AdvancedPipelineComputeChain::Run(AdvancedPipelineComputeChain *this)

{
  CallLogWrapper *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  pointer pMVar5;
  bool bVar6;
  int row_2;
  GLuint program;
  GLint GVar7;
  pointer __dest;
  void *pvVar8;
  stringstream *psVar9;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *pvVar10;
  undefined8 *puVar11;
  int row;
  long lVar12;
  float *pfVar13;
  int row_1;
  bool *extraout_RDX;
  bool *extraout_RDX_00;
  bool *compile_error;
  long lVar14;
  long *plVar15;
  ulong uVar16;
  value_type_conflict1 *__val;
  int *piVar17;
  allocator_type *__a;
  GLuint i;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  value_type_conflict5 *__val_1;
  GLuint *textures;
  string *cs;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  long local_250;
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> data_1;
  pointer local_200;
  Matrix<float,_4,_4> res_3;
  stringstream ss;
  undefined4 uStack_1b4;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [376];
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  plVar15 = &DAT_01b01a48;
  piVar17 = &DAT_01b01a3c;
  lVar18 = 0;
  cs = (string *)&res_3;
  do {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)&data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_200 = (pointer)0x262;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&data_1,(ulong)&local_200);
    pMVar5 = local_200;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = __dest;
    memcpy(__dest,
           "\nprecision highp image2D;\nstruct S0 {\n  int m0[8];\n};\nstruct S1 {\n  S0 m0[8];\n};\nlayout(binding = 0, std430) buffer Buffer0 {\n  int m0[5];\n  S1 m1[8];\n} g_buffer0;\nlayout(binding = 1, std430) buffer Buffer1 {\n  uint data[8];\n} g_buffer1;\nlayout(binding = 2, std430) buffer Buffer2 {\n  int data[256];\n} g_buffer2;\nlayout(binding = 3, std430) buffer Buffer3 {\n  int data[256];\n} g_buffer3;\nlayout(binding = 4, std430) buffer Buffer4 {\n  mat4 data0;\n  mat4 data1;\n} g_buffer4;\nlayout(binding = 0, rgba8) writeonly uniform mediump image2D g_image0;\nlayout(binding = 0, offset = 8) uniform atomic_uint g_counter[2];"
           ,0x262);
    data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pMVar5;
    *(undefined1 *)
     ((long)(pMVar5->m_data).m_data[0].m_data + (long)(__dest->m_data).m_data[0].m_data) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               (char *)data_1.
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(long)pMVar5);
    if (data_1.
        super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pointer)&data_1.
                  super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(data_1.
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)((data_1.
                                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_data).
                                    m_data[0].m_data + 1));
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(char *)((long)&DAT_01b01a3c + (long)*piVar17),*plVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,cs);
    this->m_program[lVar18] = program;
    if ((Vector<float,_4> *)res_3.m_data.m_data[0].m_data._0_8_ != res_3.m_data.m_data + 1) {
      operator_delete((void *)res_3.m_data.m_data[0].m_data._0_8_,
                      res_3.m_data.m_data[1].m_data._0_8_ + 1);
      program = this->m_program[lVar18];
    }
    glu::CallLogWrapper::glLinkProgram(this_00,program);
    if ((int)lVar18 == 1) {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[lVar18]);
      local_1a8._32_8_ = 0x41a0000041200000;
      local_1a8._40_8_ = 0x3f80000041f00000;
      local_1a8._16_8_ = 0;
      local_1a8._24_8_ = 0x3f800000;
      local_1a8._0_8_ = (_func_int **)0x3f80000000000000;
      local_1a8._8_8_ = 0;
      _ss = 0x3f800000;
      uStack_1b0 = 0;
      GVar7 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[lVar18],"g_mvp");
      glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar7,1,'\0',(GLfloat *)&ss);
LAB_00c1dcea:
      glu::CallLogWrapper::glUseProgram(this_00,0);
      compile_error = extraout_RDX_00;
    }
    else {
      compile_error = extraout_RDX;
      if ((int)lVar18 == 0) {
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[lVar18]);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation
                          (this_00,this->m_program[lVar18],"g_add_value");
        glu::CallLogWrapper::glUniform1i(this_00,GVar7,1);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation
                          (this_00,this->m_program[lVar18],"g_counter_y");
        glu::CallLogWrapper::glUniform1ui(this_00,GVar7,1);
        GVar7 = glu::CallLogWrapper::glGetUniformLocation
                          (this_00,this->m_program[lVar18],"g_image_value");
        glu::CallLogWrapper::glUniform4f(this_00,GVar7,0.25,0.5,0.75,1.0);
        goto LAB_00c1dcea;
      }
    }
    bVar6 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[lVar18],compile_error);
    if (!bVar6) {
      return -1;
    }
    lVar18 = lVar18 + 1;
    plVar15 = plVar15 + 1;
    piVar17 = piVar17 + 1;
  } while (lVar18 != 3);
  glu::CallLogWrapper::glGenBuffers(this_00,4,this->m_storage_buffer);
  pvVar8 = operator_new(0x814);
  memset(pvVar8,0,0x814);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x814,pvVar8,0x88e6);
  operator_delete(pvVar8,0x814);
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = 0;
  uStack_1b0 = 0;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x20,&ss,0x88e6);
  pvVar8 = operator_new(0x800);
  lVar18 = 0;
  do {
    puVar11 = (undefined8 *)((long)pvVar8 + lVar18 * 4);
    *puVar11 = 0x700000007;
    puVar11[1] = 0x700000007;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x800,pvVar8,0x88e6);
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,2,this->m_storage_buffer[2],0,0x400);
  glu::CallLogWrapper::glBindBufferRange(this_00,0x90d2,3,this->m_storage_buffer[2],0x400,0x400);
  operator_delete(pvVar8,0x800);
  pvVar10 = &data_1;
  __a = (allocator_type *)&ss;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (pvVar10,2,__a);
  local_1a8._32_8_ = 0;
  local_1a8._40_8_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = 0;
  uStack_1b0 = 0;
  lVar18 = 0;
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      uVar21 = 0x3f800000;
      if (lVar18 != lVar14) {
        uVar21 = 0;
      }
      *(undefined4 *)(__a + lVar14) = uVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar12 = lVar12 + 1;
    __a = __a + 4;
    lVar18 = lVar18 + 0x10;
  } while (lVar12 != 4);
  psVar9 = &ss;
  lVar18 = 0;
  pfVar13 = (float *)data_1.
                     super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  do {
    lVar12 = 0;
    do {
      *(undefined4 *)((long)pfVar13 + lVar12) = *(undefined4 *)(psVar9 + lVar12);
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar18 = lVar18 + 1;
    pfVar13 = pfVar13 + 1;
    psVar9 = psVar9 + 4;
  } while (lVar18 != 4);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[3]);
  glu::CallLogWrapper::glBufferData
            (this_00,0x90d2,
             (long)data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)data_1.
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
             data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0x88e6);
  if (data_1.
      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data_1.
                    super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)data_1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data_1.
                          super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  psVar9 = &ss;
  _ss = 0;
  uStack_1b0 = 0;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,0,this->m_counter_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x10,psVar9,0x88e6);
  pvVar8 = operator_new(0x100);
  memset(pvVar8,0,0x100);
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,4,4);
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,4,4,0x1908,0x1401,pvVar8);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  operator_delete(pvVar8,0x100);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
  glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture,0,'\0',0,0x88ba,0x8058);
  glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2020);
  glu::CallLogWrapper::glDispatchCompute(this_00,3,2,2);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
  glu::CallLogWrapper::glDispatchCompute(this_00,4,3,7);
  glu::CallLogWrapper::glMemoryBarrier(this_00,800);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
  pvVar8 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x814,1);
  lVar18 = 0;
  local_250 = 0;
  do {
    uVar3 = *(uint *)((long)pvVar8 + lVar18 * 4 + 0x14);
    if (uVar3 != 4) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,2);
      local_250 = -1;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x200);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[1]);
  pvVar8 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x20,1);
  uVar19 = 0;
  do {
    uVar16 = (ulong)*(uint *)((long)pvVar8 + uVar19 * 4);
    if (uVar19 != uVar16) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",uVar16,uVar19 & 0xffffffff);
      local_250 = -1;
    }
    uVar19 = uVar19 + 1;
  } while (uVar19 != 4);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[2]);
  pvVar8 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x800,1);
  lVar18 = 0;
  bVar6 = true;
  do {
    bVar20 = bVar6;
    uVar3 = *(uint *)((long)pvVar8 + lVar18 * 4);
    if (uVar3 != 5) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,5);
      local_250 = -1;
    }
    uVar3 = *(uint *)((long)pvVar8 + lVar18 * 4 + 0x400);
    if (uVar3 != 7) {
      anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)uVar3,7);
      local_250 = -1;
    }
    lVar18 = 1;
    bVar6 = false;
  } while (bVar20);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  lVar12 = 0;
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[3]);
  pvVar8 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x80,1);
  local_1a8._32_8_ = 0;
  local_1a8._40_8_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = 0;
  uStack_1b0 = 0;
  lVar18 = 0;
  do {
    lVar14 = 0;
    do {
      uVar21 = 0x3f800000;
      if (lVar12 != lVar14) {
        uVar21 = 0;
      }
      *(undefined4 *)(psVar9 + lVar14) = uVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar18 = lVar18 + 1;
    psVar9 = psVar9 + 4;
    lVar12 = lVar12 + 0x10;
  } while (lVar18 != 4);
  lVar18 = 0;
  do {
    uVar21 = *(undefined4 *)((long)pvVar8 + lVar18 + 0x50);
    uVar1 = *(undefined4 *)((long)pvVar8 + lVar18 + 0x60);
    uVar2 = *(undefined4 *)((long)pvVar8 + lVar18 + 0x70);
    lVar12 = lVar18 * 4;
    *(undefined4 *)(&ss + lVar12) = *(undefined4 *)((long)pvVar8 + lVar18 + 0x40);
    (&uStack_1b4)[lVar18] = uVar21;
    *(undefined4 *)((long)&uStack_1b0 + lVar12) = uVar1;
    *(undefined4 *)((long)&uStack_1b0 + lVar12 + 4) = uVar2;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x10);
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar18 = 0;
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      uVar21 = 0x3f800000;
      if (lVar18 != lVar14) {
        uVar21 = 0;
      }
      *(undefined4 *)
       ((long)&(pvVar10->
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar14) = uVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar12 = lVar12 + 1;
    pvVar10 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
              ((long)&(pvVar10->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    lVar18 = lVar18 + 0x10;
  } while (lVar12 != 4);
  pvVar10 = &data_1;
  psVar9 = &ss;
  uVar19 = 0;
  bVar6 = false;
  do {
    lVar18 = 0;
    do {
      pfVar13 = (float *)((long)&(pvVar10->
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar18);
      if ((*(float *)(psVar9 + lVar18) != *pfVar13) ||
         (NAN(*(float *)(psVar9 + lVar18)) || NAN(*pfVar13))) {
        if (!bVar6) {
          anon_unknown_0::Output("Data is incorrect.\n");
          local_250 = -1;
        }
        goto LAB_00c1e4c8;
      }
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    bVar6 = 2 < uVar19;
    uVar19 = uVar19 + 1;
    pvVar10 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
              ((long)&(pvVar10->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    psVar9 = psVar9 + 4;
  } while (uVar19 != 4);
LAB_00c1e4c8:
  psVar9 = &ss;
  local_1a8._32_8_ = 0;
  local_1a8._40_8_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = (_func_int **)0x0;
  local_1a8._8_8_ = 0;
  _ss = 0;
  uStack_1b0 = 0;
  lVar18 = 0;
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      uVar21 = 0x3f800000;
      if (lVar18 != lVar14) {
        uVar21 = 0;
      }
      *(undefined4 *)(psVar9 + lVar14) = uVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar12 = lVar12 + 1;
    psVar9 = psVar9 + 4;
    lVar18 = lVar18 + 0x10;
  } while (lVar12 != 4);
  lVar18 = 0;
  do {
    uVar21 = *(undefined4 *)((long)pvVar8 + lVar18 + 0x10);
    uVar1 = *(undefined4 *)((long)pvVar8 + lVar18 + 0x20);
    uVar2 = *(undefined4 *)((long)pvVar8 + lVar18 + 0x30);
    lVar12 = lVar18 * 4;
    *(undefined4 *)(&ss + lVar12) = *(undefined4 *)((long)pvVar8 + lVar18);
    (&uStack_1b4)[lVar18] = uVar21;
    *(undefined4 *)((long)&uStack_1b0 + lVar12) = uVar1;
    *(undefined4 *)((long)&uStack_1b0 + lVar12 + 4) = uVar2;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x10);
  res_3.m_data.m_data[3].m_data[2] = 0.0;
  res_3.m_data.m_data[3].m_data[3] = 0.0;
  res_3.m_data.m_data[2].m_data[0] = 0.0;
  res_3.m_data.m_data[2].m_data[1] = 0.0;
  res_3.m_data.m_data[2].m_data[2] = 0.0;
  res_3.m_data.m_data[2].m_data[3] = 0.0;
  res_3.m_data.m_data[1].m_data[0] = 0.0;
  res_3.m_data.m_data[1].m_data[1] = 0.0;
  res_3.m_data.m_data[1].m_data[2] = 0.0;
  res_3.m_data.m_data[1].m_data[3] = 0.0;
  res_3.m_data.m_data[0].m_data[0] = 0.0;
  res_3.m_data.m_data[0].m_data[1] = 0.0;
  res_3.m_data.m_data[0].m_data[2] = 0.0;
  res_3.m_data.m_data[0].m_data[3] = 0.0;
  lVar18 = 0;
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      uVar21 = 0x3f800000;
      if (lVar18 != lVar14) {
        uVar21 = 0;
      }
      *(undefined4 *)((long)&(cs->_M_dataplus)._M_p + lVar14) = uVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar12 = lVar12 + 1;
    cs = (string *)((long)&(cs->_M_dataplus)._M_p + 4);
    lVar18 = lVar18 + 0x10;
  } while (lVar12 != 4);
  res_3.m_data.m_data[3].m_data[0] = 10.0;
  res_3.m_data.m_data[3].m_data[1] = 20.0;
  res_3.m_data.m_data[3].m_data[2] = 30.0;
  pvVar10 = &data_1;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data_1.super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar18 = 0;
  lVar12 = 0;
  do {
    lVar14 = 0;
    do {
      uVar21 = 0x3f800000;
      if (lVar18 != lVar14) {
        uVar21 = 0;
      }
      *(undefined4 *)
       ((long)&(pvVar10->
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar14) = uVar21;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar12 = lVar12 + 1;
    pvVar10 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
              ((long)&(pvVar10->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    lVar18 = lVar18 + 0x10;
  } while (lVar12 != 4);
  lVar18 = 0;
  do {
    uVar21 = *(undefined4 *)((long)res_3.m_data.m_data[1].m_data + lVar18);
    uVar1 = *(undefined4 *)((long)res_3.m_data.m_data[2].m_data + lVar18);
    uVar2 = *(undefined4 *)((long)res_3.m_data.m_data[3].m_data + lVar18);
    lVar12 = lVar18 * 4;
    *(undefined4 *)
     ((long)&data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar12) =
         *(undefined4 *)((long)res_3.m_data.m_data[0].m_data + lVar18);
    *(undefined4 *)
     ((long)&data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar12 + 4) = uVar21;
    *(undefined4 *)
     ((long)&data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar12) = uVar1;
    *(undefined4 *)
     ((long)&data_1.
             super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + lVar12 + 4) = uVar2;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0x10);
  pvVar10 = &data_1;
  psVar9 = &ss;
  uVar19 = 0;
  bVar6 = false;
  do {
    lVar18 = 0;
    do {
      pfVar13 = (float *)((long)&(pvVar10->
                                 super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar18);
      if ((*(float *)(psVar9 + lVar18) != *pfVar13) ||
         (NAN(*(float *)(psVar9 + lVar18)) || NAN(*pfVar13))) {
        if (!bVar6) {
          anon_unknown_0::Output("Data is incorrect.\n");
          local_250 = -1;
        }
        goto LAB_00c1e6b3;
      }
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x40);
    bVar6 = 2 < uVar19;
    uVar19 = uVar19 + 1;
    pvVar10 = (vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *)
              ((long)&(pvVar10->
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 4);
    psVar9 = psVar9 + 4;
  } while (uVar19 != 4);
LAB_00c1e6b3:
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  pvVar8 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x10,1);
  if (*(uint *)((long)pvVar8 + 0xc) != 4) {
    anon_unknown_0::Output("Data is: %d should be: %d.\n",(ulong)*(uint *)((long)pvVar8 + 0xc),4);
    local_250 = -1;
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  pvVar8 = operator_new(0x100);
  memset(pvVar8,0,0x100);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
  glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
  glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
  glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
  puVar11 = (undefined8 *)operator_new(0x40);
  puVar11[6] = 0;
  puVar11[7] = 0;
  puVar11[4] = 0;
  puVar11[5] = 0;
  puVar11[2] = 0;
  puVar11[3] = 0;
  *puVar11 = 0;
  puVar11[1] = 0;
  glu::CallLogWrapper::glReadPixels(this_00,0,0,4,4,0x1908,0x1401,puVar11);
  auVar4 = _DAT_01a35670;
  lVar18 = 0;
  do {
    auVar22._0_8_ = (double)*(byte *)((long)puVar11 + lVar18);
    auVar22._8_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 4);
    auVar22 = divpd(auVar22,auVar4);
    auVar23._0_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 1);
    auVar23._8_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 5);
    auVar23 = divpd(auVar23,auVar4);
    auVar24._0_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 2);
    auVar24._8_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 6);
    auVar24 = divpd(auVar24,auVar4);
    auVar25._0_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 3);
    auVar25._8_8_ = (double)*(byte *)((long)puVar11 + lVar18 + 7);
    auVar25 = divpd(auVar25,auVar4);
    pfVar13 = (float *)((long)pvVar8 + lVar18 * 4 + 0x10);
    *pfVar13 = (float)auVar22._8_8_;
    pfVar13[1] = (float)auVar23._8_8_;
    pfVar13[2] = (float)auVar24._8_8_;
    pfVar13[3] = (float)auVar25._8_8_;
    pfVar13 = (float *)((long)pvVar8 + lVar18 * 4);
    *pfVar13 = (float)auVar22._0_8_;
    pfVar13[1] = (float)auVar23._0_8_;
    pfVar13[2] = (float)auVar24._0_8_;
    pfVar13[3] = (float)auVar25._0_8_;
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x40);
  lVar18 = 0xc;
  do {
    fVar26 = *(float *)((long)pvVar8 + lVar18 + -0xc) + -0.25;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if (0.003921569 < fVar27) {
LAB_00c1e95e:
      local_250 = -1;
      anon_unknown_0::Output("Invalid data at texture.\n");
      break;
    }
    fVar26 = *(float *)((long)pvVar8 + lVar18 + -8) + -0.5;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if (0.003921569 < fVar27) goto LAB_00c1e95e;
    fVar26 = *(float *)((long)pvVar8 + lVar18 + -4) + -0.75;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if (0.003921569 < fVar27) goto LAB_00c1e95e;
    fVar26 = *(float *)((long)pvVar8 + lVar18) + -1.0;
    fVar27 = -fVar26;
    if (-fVar26 <= fVar26) {
      fVar27 = fVar26;
    }
    if (0.003921569 < fVar27) goto LAB_00c1e95e;
    lVar18 = lVar18 + 0x10;
  } while (lVar18 != 0x10c);
  operator_delete(puVar11,0x40);
  operator_delete(pvVar8,0x100);
  return local_250;
}

Assistant:

virtual long Run()
	{
		using namespace tcu;

		for (int i = 0; i < 3; ++i)
		{
			m_program[i] = CreateComputeProgram(GenGLSL(i));
			glLinkProgram(m_program[i]);
			if (i == 0)
			{
				glUseProgram(m_program[i]);
				glUniform1i(glGetUniformLocation(m_program[i], "g_add_value"), 1);
				glUniform1ui(glGetUniformLocation(m_program[i], "g_counter_y"), 1u);
				glUniform4f(glGetUniformLocation(m_program[i], "g_image_value"), 0.25f, 0.5f, 0.75f, 1.0f);
				glUseProgram(0);
			}
			else if (i == 1)
			{
				glUseProgram(m_program[i]);
				GLfloat values[16] = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f,  1.0f,  0.0f,  0.0f,
									   0.0f, 0.0f, 1.0f, 0.0f, 10.0f, 20.0f, 30.0f, 1.0f };
				glUniformMatrix4fv(glGetUniformLocation(m_program[i], "g_mvp"), 1, GL_FALSE, values);
				glUseProgram(0);
			}
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(4, m_storage_buffer);
		/* storage buffer 0 */
		{
			std::vector<int> data(5 + 8 * 8 * 8);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(int)), &data[0], GL_STATIC_COPY);
		}
		/* storage buffer 1 */
		{
			const GLuint data[8] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* storage buffer 2 & 3 */
		{
			std::vector<GLint> data(512, 7);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(GLint)), &data[0], GL_STATIC_COPY);

			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2], 0,
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
			glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[2],
							  (GLintptr)(sizeof(GLint) * data.size() / 2),
							  (GLsizeiptr)(sizeof(GLint) * data.size() / 2));
		}
		/* storage buffer 4 */
		{
			std::vector<mat4> data(2);
			data[0] = mat4(1);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)(data.size() * sizeof(mat4)), &data[0], GL_STATIC_COPY);
		}
		/* counter buffer */
		{
			GLuint data[4] = { 0 };
			glGenBuffers(1, &m_counter_buffer);
			glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, m_counter_buffer);
			glBufferData(GL_ATOMIC_COUNTER_BUFFER, sizeof(data), data, GL_STATIC_COPY);
		}
		/* texture */
		{
			std::vector<GLint> data(4 * 4 * 4, 0);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 4, 4);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glUseProgram(m_program[0]);
		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA8);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT | GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		glDispatchCompute(3, 2, 2);

		glUseProgram(m_program[1]);
		glDispatchCompute(4, 3, 7);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT | GL_TEXTURE_UPDATE_BARRIER_BIT |
						GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		long error = NO_ERROR;
		/* validate storage buffer 0 */
		{
			int* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			data = static_cast<int*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * (5 + 8 * 8 * 8), GL_MAP_READ_BIT));
			for (std::size_t i = 5; i < 5 + 8 * 8 * 8; ++i)
			{
				if (data[i] != 4)
				{
					Output("Data is: %d should be: %d.\n", data[i], 2);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 1 */
		{
			GLuint* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * 8, GL_MAP_READ_BIT));
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != i)
				{
					Output("Data is: %d should be: %d.\n", data[i], i);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 2 & 3 */
		{
			GLint* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[2]);
			data = static_cast<GLint*>(
				glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLint) * 512, GL_MAP_READ_BIT));
			for (int i = 0; i < 2; ++i)
			{
				if (data[i] != 5)
				{
					Output("Data is: %d should be: %d.\n", data[i], 5);
					error = ERROR;
				}
				if (data[i + 256] != 7)
				{
					Output("Data is: %d should be: %d.\n", data[i + 256], 7);
					error = ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate storage buffer 4 */
		{
			mat4* data;
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[3]);
			data = static_cast<mat4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(mat4) * 2, GL_MAP_READ_BIT));
			if (transpose(data[1]) != translationMatrix(vec3(10.0f, 20.0f, 30.0f)))
			{
				Output("Data is incorrect.\n");
				error = ERROR;
			}
			if (transpose(data[0]) != transpose(translationMatrix(vec3(10.0f, 20.0f, 30.0f))))
			{
				Output("Data is incorrect.\n");
				error = ERROR;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}
		/* validate counter buffer */
		{
			GLuint* data;
			data = static_cast<GLuint*>(
				glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(GLuint) * 4, GL_MAP_READ_BIT));
			if (data[3] != 4)
			{
				Output("Data is: %d should be: %d.\n", data[3], 4);
				error = ERROR;
			}
			glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		}
		/* validate texture */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			vec4 epsilon = vec4(1.0f / 255.0f, 1.0f / 255.0f, 1.0f / 255.0f, 1.0f / 255.0f); // texture format is RGBA8.
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!ColorEqual(data[i], vec4(0.25f, 0.5f, 0.75f, 1.0f), epsilon))
				{
					Output("Invalid data at texture.\n");
					return ERROR;
				}
			}
		}

		return error;
	}